

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

size_t secp256k1_context_preallocated_size(uint flags)

{
  uint in_EDI;
  bool bVar1;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  size_t ret;
  char *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined8 local_8;
  
  if ((in_EDI & 0xff) == 1) {
    bVar1 = (in_EDI & 0x400) != 0;
    if (bVar1) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT17(bVar1,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      local_8 = 0;
    }
    else {
      local_8 = 0xd0;
    }
  }
  else {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t secp256k1_context_preallocated_size(unsigned int flags) {
    size_t ret = sizeof(secp256k1_context);
    /* A return value of 0 is reserved as an indicator for errors when we call this function internally. */
    VERIFY_CHECK(ret != 0);

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&default_illegal_callback,
                                    "Invalid flags");
            return 0;
    }

    if (EXPECT(!SECP256K1_CHECKMEM_RUNNING() && (flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY), 0)) {
            secp256k1_callback_call(&default_illegal_callback,
                                    "Declassify flag requires running with memory checking");
            return 0;
    }

    return ret;
}